

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstract_transaction.cpp
# Opt level: O3

void __thiscall
AbstractTransaction_GetLockTime_Test::TestBody(AbstractTransaction_GetLockTime_Test *this)

{
  bool bVar1;
  char *message;
  AssertionResult gtest_ar;
  Transaction tx;
  Message local_68;
  AssertHelper local_60;
  internal local_58 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  Transaction local_48;
  
  cfd::core::Transaction::Transaction(&local_48,2,3);
  local_68.ss_.ptr_._0_4_ =
       cfd::core::AbstractTransaction::GetLockTime(&local_48.super_AbstractTransaction);
  local_60.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            (local_58,"tx.GetLockTime()","3",(uint *)&local_68,(int *)&local_60);
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message(&local_68);
    if (local_50.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_50.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x5d,message);
    testing::internal::AssertHelper::operator=(&local_60,&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (CONCAT44(local_68.ss_.ptr_._4_4_,(uint32_t)local_68.ss_.ptr_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_68.ss_.ptr_._4_4_,(uint32_t)local_68.ss_.ptr_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_68.ss_.ptr_._4_4_,(uint32_t)local_68.ss_.ptr_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Transaction::~Transaction(&local_48);
  return;
}

Assistant:

TEST(AbstractTransaction, GetLockTime) {
  Transaction tx(2, 3);
  EXPECT_EQ(tx.GetLockTime(), 3);
}